

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O3

bool __thiscall
S2MinDistanceCellTarget::VisitContainingShapes
          (S2MinDistanceCellTarget *this,S2ShapeIndex *index,ShapeVisitor *visitor)

{
  bool bVar1;
  S2MinDistancePointTarget local_38;
  
  S2Cell::GetCenter(&local_38.point_,&this->cell_);
  local_38.super_S2MinDistanceTarget._vptr_S2DistanceTarget =
       (_func_int **)&PTR__S2DistanceTarget_002bc9b0;
  bVar1 = S2MinDistancePointTarget::VisitContainingShapes(&local_38,index,visitor);
  return bVar1;
}

Assistant:

bool S2MinDistanceCellTarget::VisitContainingShapes(
    const S2ShapeIndex& index, const ShapeVisitor& visitor) {
  // The simplest approach is simply to return the polygons that contain the
  // cell center.  Alternatively, if the index cell is smaller than the target
  // cell then we could return all polygons that are present in the
  // S2ShapeIndexCell, but since the index is built conservatively this may
  // include some polygons that don't quite intersect the cell.  So we would
  // either need to recheck for intersection more accurately, or weaken the
  // VisitContainingShapes contract so that it only guarantees approximate
  // intersection, neither of which seems like a good tradeoff.
  S2MinDistancePointTarget target(cell_.GetCenter());
  return target.VisitContainingShapes(index, visitor);
}